

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O1

int tclpkcs11_list_certs_der(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  long lVar1;
  long *data;
  _func_int_Tcl_Interp_ptr_Tcl_Obj_ptr_Tcl_Obj_ptr *p_Var2;
  bool bVar3;
  Tcl_Obj *pTVar4;
  tclpkcs11_handle *ptVar5;
  bool bVar6;
  tclpkcs11_handle *ptVar7;
  int iVar8;
  long lVar9;
  Tcl_Obj *pTVar10;
  Tcl_Obj *pTVar11;
  char *pcVar12;
  Tcl_Obj *pTVar13;
  Tcl_Obj *pTVar14;
  long *plVar15;
  CK_RV CVar16;
  ProcErrorProc *pPVar17;
  tclpkcs11_handle *handle;
  CK_OBJECT_HANDLE hObject;
  CK_ULONG ulObjectCount;
  long slotid_long;
  CK_ATTRIBUTE template [4];
  CK_ATTRIBUTE cert_templ [1];
  Tcl_Obj *local_f0;
  Tcl_Obj *local_e8;
  Tcl_Obj *local_e0;
  CK_OBJECT_HANDLE local_d8;
  CK_ULONG local_d0;
  Tcl_Obj *local_c8;
  Tcl_Obj *local_c0;
  tclpkcs11_handle *local_b8;
  CK_SLOT_ID local_b0;
  CK_ATTRIBUTE local_a8;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  CK_ATTRIBUTE local_48;
  
  local_48.ulValueLen = 8;
  local_48.type = 0;
  local_48.pValue = &tclpkcs11_list_certs_der::oclass_cert;
  local_a8.ulValueLen = 0;
  uStack_70 = 0;
  local_68 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_a8.type = 0;
  local_a8.pValue = (CK_VOID_PTR)0x0;
  uStack_90 = 3;
  local_78 = 0x102;
  uStack_60 = 0x11;
  if (cd == (ClientData)0x0) {
    pPVar17 = tclStubsPtr->tcl_SetObjResult;
    pcVar12 = "invalid clientdata";
  }
  else if (objc == 3) {
    pTVar10 = objv[1];
    pTVar13 = objv[2];
    lVar9 = (**(code **)((long)cd + 0x40))(cd,pTVar10);
    if ((lVar9 != 0) &&
       (handle = *(tclpkcs11_handle **)(lVar9 + 0x18), handle != (tclpkcs11_handle *)0x0)) {
      iVar8 = (*tclStubsPtr->tcl_GetLongFromObj)
                        ((Tcl_Interp_conflict *)interp,pTVar13,(long *)&local_b0);
      if (iVar8 != 0) {
        return iVar8;
      }
      iVar8 = tclpkcs11_start_session(handle,local_b0);
      if (iVar8 == 0) {
        CVar16 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,&local_48,1);
        if (CVar16 == 0) {
          pTVar11 = (*tclStubsPtr->tcl_NewObj)();
          CVar16 = (*handle->pkcs11->C_FindObjects)(handle->session,&local_d8,1,&local_d0);
          ptVar7 = handle;
          pTVar14 = local_c8;
          pTVar4 = local_c0;
          ptVar5 = local_b8;
joined_r0x00104001:
          local_b8 = ptVar7;
          local_c8 = pTVar13;
          local_c0 = pTVar10;
          if (CVar16 == 0) {
            if (local_d0 == 1) {
              lVar9 = 8;
              do {
                pcVar12 = *(char **)((long)&local_a8.type + lVar9);
                if (pcVar12 != (char *)0x0) {
                  (*tclStubsPtr->tcl_Free)(pcVar12);
                }
                *(undefined8 *)((long)&local_a8.type + lVar9) = 0;
                *(undefined8 *)((long)&local_a8.pValue + lVar9) = 0;
                lVar9 = lVar9 + 0x18;
              } while (lVar9 != 0x68);
              CVar16 = (*handle->pkcs11->C_GetAttributeValue)(handle->session,local_d8,&local_a8,4);
              if (((0x12 < CVar16) || ((0x60001UL >> (CVar16 & 0x3f) & 1) == 0)) &&
                 (CVar16 != 0x150)) goto LAB_00104400;
              lVar9 = 0x10;
              do {
                lVar1 = *(long *)((long)&local_a8.type + lVar9);
                if (lVar1 != -1) {
                  pcVar12 = (*tclStubsPtr->tcl_Alloc)((uint)lVar1);
                  *(char **)((long)&local_b0 + lVar9) = pcVar12;
                }
                lVar9 = lVar9 + 0x18;
              } while (lVar9 != 0x70);
              CVar16 = (*handle->pkcs11->C_GetAttributeValue)(handle->session,local_d8,&local_a8,4);
              if (((CVar16 < 0x13) && ((0x60001UL >> (CVar16 & 0x3f) & 1) != 0)) ||
                 (CVar16 == 0x150)) {
                plVar15 = (long *)0x0;
                lVar9 = 0x10;
                bVar3 = false;
                local_e0 = (Tcl_Obj *)0x0;
                local_e8 = (Tcl_Obj *)0x0;
                local_f0 = (Tcl_Obj *)0x0;
                do {
                  data = *(long **)((long)&local_b0 + lVar9);
                  if (data != (long *)0x0) {
                    lVar1 = *(long *)((long)&local_b8 + lVar9);
                    bVar6 = bVar3;
                    if (lVar1 < 0x11) {
                      if (lVar1 == 0) {
                        plVar15 = data;
                        bVar6 = true;
                        if (*data != 1) goto LAB_001041f9;
                      }
                      else if (lVar1 == 3) {
                        local_e0 = (*tclStubsPtr->tcl_NewStringObj)
                                             ((char *)data,*(int *)((long)&local_a8.type + lVar9));
                      }
                    }
                    else if (lVar1 == 0x11) {
                      if (plVar15 == (long *)0x0) {
                        plVar15 = (long *)0x0;
                      }
                      else {
                        local_f0 = tclpkcs11_bytearray_to_string
                                             ((uchar *)data,
                                              *(unsigned_long *)((long)&local_a8.type + lVar9));
                      }
                    }
                    else if (lVar1 == 0x102) {
                      local_e8 = tclpkcs11_bytearray_to_string
                                           ((uchar *)data,
                                            *(unsigned_long *)((long)&local_a8.type + lVar9));
                    }
                    bVar3 = bVar6;
                    (*tclStubsPtr->tcl_Free)(*(char **)((long)&local_b0 + lVar9));
                    *(undefined8 *)((long)&local_b0 + lVar9) = 0;
                  }
LAB_001041f9:
                  handle = local_b8;
                  pTVar10 = local_c0;
                  lVar9 = lVar9 + 0x18;
                } while (lVar9 != 0x70);
                if (((bVar3) && (local_e0 != (Tcl_Obj *)0x0)) &&
                   ((local_e8 != (Tcl_Obj *)0x0 && (local_f0 != (Tcl_Obj *)0x0)))) {
                  pTVar13 = (*tclStubsPtr->tcl_NewObj)();
                  p_Var2 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar14 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_handle",-1);
                  (*p_Var2)((Tcl_Interp_conflict *)interp,pTVar13,pTVar14);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar13,pTVar10);
                  p_Var2 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar10 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_slotid",-1);
                  (*p_Var2)((Tcl_Interp_conflict *)interp,pTVar13,pTVar10);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar13,local_c8);
                  p_Var2 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar10 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_id",-1);
                  (*p_Var2)((Tcl_Interp_conflict *)interp,pTVar13,pTVar10);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar13,local_e8);
                  p_Var2 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar10 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_label",-1);
                  (*p_Var2)((Tcl_Interp_conflict *)interp,pTVar13,pTVar10);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar13,local_e0);
                  p_Var2 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar10 = (*tclStubsPtr->tcl_NewStringObj)("cert_der",-1);
                  (*p_Var2)((Tcl_Interp_conflict *)interp,pTVar13,pTVar10);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar13,local_f0);
                  p_Var2 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar10 = (*tclStubsPtr->tcl_NewStringObj)("type",-1);
                  (*p_Var2)((Tcl_Interp_conflict *)interp,pTVar13,pTVar10);
                  p_Var2 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar10 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11",-1);
                  (*p_Var2)((Tcl_Interp_conflict *)interp,pTVar13,pTVar10);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar11,pTVar13);
                }
                goto LAB_00104400;
              }
              lVar9 = 8;
              do {
                pcVar12 = *(char **)((long)&local_a8.type + lVar9);
                if (pcVar12 != (char *)0x0) {
                  (*tclStubsPtr->tcl_Free)(pcVar12);
                }
                lVar9 = lVar9 + 0x18;
              } while (lVar9 != 0x68);
              pPVar17 = tclStubsPtr->tcl_SetObjResult;
              goto LAB_00104011;
            }
            if (local_d0 == 0) {
              (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
              (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,pTVar11);
              return 0;
            }
            pPVar17 = tclStubsPtr->tcl_SetObjResult;
            pTVar10 = (*tclStubsPtr->tcl_NewStringObj)
                                ("FindObjects() returned a weird number of objects.",-1);
          }
          else {
            pPVar17 = tclStubsPtr->tcl_SetObjResult;
            local_c8 = pTVar14;
            local_c0 = pTVar4;
            local_b8 = ptVar5;
LAB_00104011:
            pTVar10 = tclpkcs11_pkcs11_error(CVar16);
          }
          (*pPVar17)((Tcl_Interp_conflict *)interp,pTVar10);
          (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
          return 1;
        }
        pPVar17 = tclStubsPtr->tcl_SetObjResult;
      }
      else {
        CVar16 = (CK_RV)iVar8;
        pPVar17 = tclStubsPtr->tcl_SetObjResult;
      }
      pTVar10 = tclpkcs11_pkcs11_error(CVar16);
      goto LAB_00103f83;
    }
    pPVar17 = tclStubsPtr->tcl_SetObjResult;
    pcVar12 = "invalid handle";
  }
  else {
    pPVar17 = tclStubsPtr->tcl_SetObjResult;
    pcVar12 = "wrong # args: should be \"pki::pkcs11::listcertsder handle slot\"";
  }
  pTVar10 = (*tclStubsPtr->tcl_NewStringObj)(pcVar12,-1);
LAB_00103f83:
  (*pPVar17)((Tcl_Interp_conflict *)interp,pTVar10);
  return 1;
LAB_00104400:
  CVar16 = (*handle->pkcs11->C_FindObjects)(handle->session,&local_d8,1,&local_d0);
  pTVar10 = local_c0;
  pTVar13 = local_c8;
  ptVar7 = local_b8;
  pTVar14 = local_c8;
  pTVar4 = local_c0;
  ptVar5 = local_b8;
  goto joined_r0x00104001;
}

Assistant:

MODULE_SCOPE int tclpkcs11_list_certs_der(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid;
  long slotid_long;
  Tcl_Obj *obj_label, *obj_id, *obj_cert_der;
  Tcl_Obj *ret_list, *curr_item_list;
  int tcl_rv;
  int type_cert;
  CK_SLOT_ID slotid;
  CK_OBJECT_HANDLE hObject;
  CK_ULONG ulObjectCount;
  static CK_OBJECT_CLASS     oclass_cert     = CKO_CERTIFICATE;
  //	                           {CKA_ID, NULL, 0},
  CK_ATTRIBUTE cert_templ[] = {
    {CKA_CLASS, &oclass_cert, sizeof(oclass_cert)},
  };
  CK_ATTRIBUTE template[] = {
    {CKA_CLASS, NULL, 0},
    {CKA_LABEL, NULL, 0},
    {CKA_ID, NULL, 0},
    {CKA_VALUE, NULL, 0}
  }, *curr_attr;
  CK_ULONG curr_attr_idx;
  CK_OBJECT_CLASS *objectclass;
  CK_RV chk_rv;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 3) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::listcertsder handle slot\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;

  chk_rv = tclpkcs11_start_session(handle, slotid);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  //	chk_rv = handle->pkcs11->C_FindObjectsInit(handle->session, NULL, 0);
  chk_rv = handle->pkcs11->C_FindObjectsInit(handle->session,  cert_templ, sizeof(cert_templ) / sizeof(cert_templ[0]));
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  ret_list = Tcl_NewObj();
  while (1) {
    type_cert = 0;	
    chk_rv = handle->pkcs11->C_FindObjects(handle->session, &hObject, 1, &ulObjectCount);
    if (chk_rv != CKR_OK) {
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

      handle->pkcs11->C_FindObjectsFinal(handle->session);

      return(TCL_ERROR);
    }

    if (ulObjectCount == 0) {
      break;
    }

    if (ulObjectCount != 1) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("FindObjects() returned a weird number of objects.", -1));

      handle->pkcs11->C_FindObjectsFinal(handle->session);

      return(TCL_ERROR);
    }

    for (curr_attr_idx = 0; curr_attr_idx < (sizeof(template) / sizeof(template[0])); curr_attr_idx++) {
      curr_attr = &template[curr_attr_idx];
      if (curr_attr->pValue) {
        ckfree(curr_attr->pValue);
      }

      curr_attr->pValue = NULL;
      curr_attr->ulValueLen = 0;
    }

    /* Determine size of values to allocate */
    chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, template, sizeof(template) / sizeof(template[0]));
    if (chk_rv == CKR_ATTRIBUTE_TYPE_INVALID || chk_rv == CKR_ATTRIBUTE_SENSITIVE || chk_rv == CKR_BUFFER_TOO_SMALL) {
      chk_rv = CKR_OK;
    }

    if (chk_rv != CKR_OK) {
      /* Skip this object if we are not able to process it */
      continue;
    }

    /* Allocate values */
    for (curr_attr_idx = 0; curr_attr_idx < (sizeof(template) / sizeof(template[0])); curr_attr_idx++) {
      curr_attr = &template[curr_attr_idx];

      if (((CK_LONG) curr_attr->ulValueLen) != ((CK_LONG) -1)) {
        curr_attr->pValue = (void *) ckalloc(curr_attr->ulValueLen);
      }
    }

    /* Populate template values */
    chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, template, sizeof(template) / sizeof(template[0]));
    if (chk_rv != CKR_OK && chk_rv != CKR_ATTRIBUTE_SENSITIVE && chk_rv != CKR_ATTRIBUTE_TYPE_INVALID && chk_rv != CKR_BUFFER_TOO_SMALL) {
      /* Return an error if we are unable to process this entry due to unexpected errors */
      for (curr_attr_idx = 0; curr_attr_idx < (sizeof(template) / sizeof(template[0])); curr_attr_idx++) {
        curr_attr = &template[curr_attr_idx];
        if (curr_attr->pValue) {
          ckfree(curr_attr->pValue);
        }
      }

      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

      handle->pkcs11->C_FindObjectsFinal(handle->session);

      return(TCL_ERROR);
    }

    /* Extract certificate data */
    obj_label = NULL;
    obj_id = NULL;
    obj_cert_der = NULL;
    objectclass = NULL;
    for (curr_attr_idx = 0; curr_attr_idx < (sizeof(template) / sizeof(template[0])); curr_attr_idx++) {
      curr_attr = &template[curr_attr_idx];

      if (!curr_attr->pValue) {
        continue;
      }

      switch (curr_attr->type) {
        case CKA_CLASS:
          objectclass = (CK_OBJECT_CLASS *) curr_attr->pValue;
          if (*objectclass != CKO_CERTIFICATE) {
            continue;
          }
          type_cert = 1;
          break;
        case CKA_LABEL:
          obj_label = Tcl_NewStringObj(curr_attr->pValue, curr_attr->ulValueLen);
          break;
        case CKA_ID:
          /* Convert the ID into a readable string */
          obj_id = tclpkcs11_bytearray_to_string(curr_attr->pValue, curr_attr->ulValueLen);

          break;
        case CKA_VALUE:
          /*LISSI*/
          //fprintf (stderr, "tclpkcs11_list_certs_der: LEN_VALUE=%lu\n", curr_attr->ulValueLen);
          if (!objectclass) {
            break;
          }

          /* Convert the DER_CERT into a readable string */
          obj_cert_der = tclpkcs11_bytearray_to_string(curr_attr->pValue, curr_attr->ulValueLen);

          break;
      }

      ckfree(curr_attr->pValue);
      curr_attr->pValue = NULL;
    }
    if (type_cert == 0) {
      continue;
    }

    /* Add this certificate data to return list, if all found */
    if (obj_label == NULL || obj_id == NULL || obj_cert_der == NULL) {
      continue;
    }

    /* Create the current item list */
    curr_item_list = Tcl_NewObj();
    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_handle", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, tcl_handle);

    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_slotid", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, tcl_slotid);

    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_id", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, obj_id);

    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_label", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, obj_label);

    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("cert_der", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, obj_cert_der);

    /*
    * Override the "type" so that [array set] returns our new
    * type, but we can still parse through the list and figure
    * out the real subordinate type
    */
    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("type", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11", -1));

    /* Add the current item to the return value list */
    Tcl_ListObjAppendElement(interp, ret_list, curr_item_list);
  }

  /* Terminate search */
  handle->pkcs11->C_FindObjectsFinal(handle->session);

  /* Return */
  Tcl_SetObjResult(interp, ret_list);
  //	Tcl_SetObjResult(interp, curr_item_list);

  return(TCL_OK);
}